

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O0

bool __thiscall ON_WindowsBitmap::WriteUncompressed(ON_WindowsBitmap *this,ON_BinaryArchive *file)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  bool local_61;
  size_t sizeof_image;
  bool local_47;
  int color_count;
  bool rc;
  ON__INT32 OStack_40;
  short s;
  int i;
  ON_WindowsBITMAPINFOHEADER bmiHeader;
  ON_BinaryArchive *file_local;
  ON_WindowsBitmap *this_local;
  
  bmiHeader._32_8_ = file;
  if (this->m_bmi == (ON_WindowsBITMAPINFO *)0x0) {
    memset(&stack0xffffffffffffffc0,0,0x28);
  }
  else {
    memcpy(&stack0xffffffffffffffc0,this->m_bmi,0x28);
    OStack_40 = 0x28;
  }
  local_47 = ON_BinaryArchive::WriteInt((ON_BinaryArchive *)bmiHeader._32_8_,OStack_40);
  if (local_47) {
    local_47 = ON_BinaryArchive::WriteInt((ON_BinaryArchive *)bmiHeader._32_8_,i);
  }
  if (local_47 != false) {
    local_47 = ON_BinaryArchive::WriteInt((ON_BinaryArchive *)bmiHeader._32_8_,bmiHeader.biSize);
  }
  if (local_47 != false) {
    local_47 = ON_BinaryArchive::WriteShort
                         ((ON_BinaryArchive *)bmiHeader._32_8_,(ON__INT16)bmiHeader.biWidth);
  }
  if (local_47 != false) {
    local_47 = ON_BinaryArchive::WriteShort
                         ((ON_BinaryArchive *)bmiHeader._32_8_,bmiHeader.biWidth._2_2_);
  }
  if (local_47 != false) {
    local_47 = ON_BinaryArchive::WriteInt((ON_BinaryArchive *)bmiHeader._32_8_,bmiHeader.biHeight);
  }
  if (local_47 != false) {
    local_47 = ON_BinaryArchive::WriteInt((ON_BinaryArchive *)bmiHeader._32_8_,bmiHeader._12_4_);
  }
  if (local_47 != false) {
    local_47 = ON_BinaryArchive::WriteInt
                         ((ON_BinaryArchive *)bmiHeader._32_8_,bmiHeader.biCompression);
  }
  if (local_47 != false) {
    local_47 = ON_BinaryArchive::WriteInt
                         ((ON_BinaryArchive *)bmiHeader._32_8_,bmiHeader.biSizeImage);
  }
  if (local_47 != false) {
    local_47 = ON_BinaryArchive::WriteInt
                         ((ON_BinaryArchive *)bmiHeader._32_8_,bmiHeader.biXPelsPerMeter);
  }
  if (local_47 != false) {
    local_47 = ON_BinaryArchive::WriteInt
                         ((ON_BinaryArchive *)bmiHeader._32_8_,bmiHeader.biYPelsPerMeter);
  }
  if (local_47 != false) {
    iVar1 = PaletteColorCount(this);
    color_count = 0;
    while( true ) {
      local_61 = false;
      if (color_count < iVar1) {
        local_61 = local_47;
      }
      if (local_61 == false) break;
      if (local_47 != false) {
        local_47 = ON_BinaryArchive::WriteChar
                             ((ON_BinaryArchive *)bmiHeader._32_8_,
                              this->m_bmi->bmiColors[color_count].rgbBlue);
      }
      if (local_47 != false) {
        local_47 = ON_BinaryArchive::WriteChar
                             ((ON_BinaryArchive *)bmiHeader._32_8_,
                              this->m_bmi->bmiColors[color_count].rgbGreen);
      }
      if (local_47 != false) {
        local_47 = ON_BinaryArchive::WriteChar
                             ((ON_BinaryArchive *)bmiHeader._32_8_,
                              this->m_bmi->bmiColors[color_count].rgbRed);
      }
      if (local_47 != false) {
        local_47 = ON_BinaryArchive::WriteChar
                             ((ON_BinaryArchive *)bmiHeader._32_8_,
                              this->m_bmi->bmiColors[color_count].rgbReserved);
      }
      color_count = color_count + 1;
    }
    iVar2 = (*(this->super_ON_Bitmap).super_ON_ModelComponent.super_ON_Object._vptr_ON_Object[0x1c])
                      ();
    if (((CONCAT44(extraout_var,iVar2) != 0) && (local_47 != false)) && (local_47 != false)) {
      local_47 = ON_BinaryArchive::WriteByte
                           ((ON_BinaryArchive *)bmiHeader._32_8_,CONCAT44(extraout_var,iVar2),
                            this->m_bmi->bmiColors + iVar1);
    }
  }
  return local_47;
}

Assistant:

bool ON_WindowsBitmap::WriteUncompressed( ON_BinaryArchive& file ) const
{
#if defined(ON_OS_WINDOWS_GDI)
  BITMAPINFOHEADER bmiHeader;
#else
  ON_WindowsBITMAPINFOHEADER bmiHeader;
#endif

  if ( m_bmi )
  {
    bmiHeader = m_bmi->bmiHeader;
    bmiHeader.biSize = sizeof(bmiHeader);
  }
  else 
  {
    memset(&bmiHeader,0,sizeof(bmiHeader));
  }
  int i;
  short s;
  i = bmiHeader.biSize;
  bool    rc = file.WriteInt(i);
  i = bmiHeader.biWidth;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biHeight;
  if (rc) rc = file.WriteInt(i);
  s = bmiHeader.biPlanes;
  if (rc) rc = file.WriteShort(s);
  s = bmiHeader.biBitCount;
  if (rc) rc = file.WriteShort(s);
  i = bmiHeader.biCompression;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biSizeImage;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biXPelsPerMeter;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biYPelsPerMeter;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biClrUsed;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biClrImportant;
  if (rc) rc = file.WriteInt(i);

  if ( rc ) 
  {
    const int color_count = PaletteColorCount();
    for (i = 0; i < color_count && rc; i++ )
    {
      if (rc) rc = file.WriteChar( m_bmi->bmiColors[i].rgbBlue );
      if (rc) rc = file.WriteChar( m_bmi->bmiColors[i].rgbGreen );
      if (rc) rc = file.WriteChar( m_bmi->bmiColors[i].rgbRed );
      if (rc) rc = file.WriteChar( m_bmi->bmiColors[i].rgbReserved );
    }
    const size_t sizeof_image = SizeofImage();
    if ( sizeof_image > 0 && rc ) 
    {
      if (rc) rc = file.WriteByte( sizeof_image, &m_bmi->bmiColors[color_count] );
    }
  }

  return rc;
}